

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

wchar_t cmp_u16n(uint16_t *a,uint16_t *b,size_t na,size_t nb)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (na < nb) {
    lVar3 = nb - na;
    uVar4 = 0;
    lVar5 = 0;
    do {
      if (b[lVar5] != 0) {
        return L'\xffffffff';
      }
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
  }
  else {
    uVar4 = na - nb;
    if (uVar4 == 0) {
      uVar4 = 0;
      lVar3 = 0;
    }
    else {
      lVar3 = 0;
      uVar6 = 0;
      do {
        if (a[uVar6] != 0) {
          return L'\x01';
        }
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
  }
  if (uVar4 < na) {
    lVar5 = 0;
    do {
      if (nb <= (ulong)(lVar3 + lVar5)) {
        __assert_fail("ib < nb",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x462,"int cmp_u16n(const uint16_t *, const uint16_t *, size_t, size_t)");
      }
      uVar1 = b[lVar3 + lVar5];
      uVar2 = a[uVar4 + lVar5];
      if (uVar2 >= uVar1 && uVar2 != uVar1) {
        return L'\x01';
      }
      if (uVar2 < uVar1) {
        return L'\xffffffff';
      }
      lVar5 = lVar5 + 1;
    } while (na - uVar4 != lVar5);
  }
  return L'\0';
}

Assistant:

static int cmp_u16n(const uint16_t *a, const uint16_t *b, size_t na, size_t nb)
{
	size_t ia = 0, ib = 0;

	if (na >= nb) {
		while (ia < na - nb) {
			if (a[ia]) {
				return 1;
			}
			++ia;
		}
	} else {
		while (ib < nb - na) {
			if (b[ib]) {
				return -1;
			}
			++ib;
		}
	}
	while (ia < na) {
		assert(ib < nb);
		if (a[ia] > b[ib]) {
			return 1;
		}
		if (a[ia] < b[ib]) {
			return -1;
		}
		++ia;
		++ib;
	}
	return 0;
}